

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limits.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::constantIndexExpressionCheck(TParseContext *this,TIntermNode *index)

{
  TIndexTraverser TStack_78;
  
  TIndexTraverser::TIndexTraverser(&TStack_78,&this->inductiveLoopIds);
  (*index->_vptr_TIntermNode[2])(index,&TStack_78);
  if (TStack_78.bad == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,&TStack_78.badLoc,"Non-constant-index-expression","limitations","");
  }
  return;
}

Assistant:

void TParseContext::constantIndexExpressionCheck(TIntermNode* index)
{
    TIndexTraverser it(inductiveLoopIds);

    index->traverse(&it);

    if (it.bad)
        error(it.badLoc, "Non-constant-index-expression", "limitations", "");
}